

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMultiCond.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionMultiCond::InstructionMultiCond
          (InstructionMultiCond *this,Context *cx,Vec<Hpipe::Cond> *conds,int off_data)

{
  Context local_98;
  int local_24;
  Vec<Hpipe::Cond> *pVStack_20;
  int off_data_local;
  Vec<Hpipe::Cond> *conds_local;
  Context *cx_local;
  InstructionMultiCond *this_local;
  
  local_24 = off_data;
  pVStack_20 = conds;
  conds_local = (Vec<Hpipe::Cond> *)cx;
  cx_local = (Context *)this;
  Context::Context(&local_98,cx);
  Instruction::Instruction(&this->super_Instruction,&local_98);
  Context::~Context(&local_98);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__InstructionMultiCond_002902c8;
  Vec<Hpipe::Cond>::Vec(&this->conds,pVStack_20);
  this->off_data = local_24;
  return;
}

Assistant:

InstructionMultiCond::InstructionMultiCond( const Context &cx, const Vec<Cond> &conds, int off_data ) : Instruction( cx ), conds( conds ), off_data( off_data ) {
}